

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O0

int duckdb_lz4::LZ4_compress_destSize(char *src,char *dst,int *srcSizePtr,int targetDstSize)

{
  int iVar1;
  int result;
  LZ4_stream_t *ctx;
  LZ4_stream_t ctxBody;
  int in_stack_ffffffffffffbfdc;
  int *in_stack_ffffffffffffbfe0;
  char *in_stack_ffffffffffffbfe8;
  char *in_stack_ffffffffffffbff0;
  LZ4_stream_t *in_stack_ffffffffffffbff8;
  
  iVar1 = LZ4_compress_destSize_extState
                    (in_stack_ffffffffffffbff8,in_stack_ffffffffffffbff0,in_stack_ffffffffffffbfe8,
                     in_stack_ffffffffffffbfe0,in_stack_ffffffffffffbfdc);
  return iVar1;
}

Assistant:

int LZ4_compress_destSize(const char* src, char* dst, int* srcSizePtr, int targetDstSize)
{
#if (LZ4_HEAPMODE)
    LZ4_stream_t* ctx = (LZ4_stream_t*)ALLOC(sizeof(LZ4_stream_t));   /* malloc-calloc always properly aligned */
    if (ctx == NULL) return 0;
#else
    LZ4_stream_t ctxBody;
    LZ4_stream_t* ctx = &ctxBody;
#endif

    int result = LZ4_compress_destSize_extState(ctx, src, dst, srcSizePtr, targetDstSize);

#if (LZ4_HEAPMODE)
    FREEMEM(ctx);
#endif
    return result;
}